

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O3

void RigidBodyDynamics::CalcContactSystemVariables
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS)

{
  ConstraintSet *QDDot;
  double *pdVar1;
  long lVar2;
  uint body_id;
  pointer pSVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  SpatialTransform *pSVar9;
  pointer pSVar10;
  uint uVar11;
  ActualDstType actualDst;
  bool bVar12;
  byte bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  SpatialTransform local_98;
  
  bVar13 = 0;
  NonlinearEffects(model,Q,QDot,(VectorNd *)(CS + 0xc0));
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)(CS + 0xa8),false);
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar6 = 1;
    uVar8 = 2;
    do {
      Math::SpatialTransform::operator*
                (&local_98,
                 (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar6,
                 (model->X_base).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar6]);
      pSVar3 = (model->X_base).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar9 = &local_98;
      pSVar10 = pSVar3 + uVar6;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(double *)&(pSVar10->E).super_Matrix3d =
             (pSVar9->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[0];
        pSVar9 = (SpatialTransform *)((long)pSVar9 + (ulong)bVar13 * -0x10 + 8);
        pSVar10 = (pointer)((long)pSVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      *(double *)((long)&pSVar3[uVar6].r.super_Vector3d + 0x10) =
           local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
      *(double *)
       &pSVar3[uVar6].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
           = local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
      *(double *)
       ((long)&pSVar3[uVar6].r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
           local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
      uVar6 = ((long)(model->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      bVar12 = uVar8 <= uVar6;
      lVar5 = uVar6 - uVar8;
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar12 && lVar5 != 0);
  }
  CalcContactJacobian(model,Q,CS,(MatrixNd *)(CS + 0xe0),false);
  QDDot = CS + 0x210;
  if (0 < *(long *)(CS + 0x218)) {
    memset(*(void **)QDDot,0,*(long *)(CS + 0x218) << 3);
  }
  UpdateKinematicsCustom(model,(VectorNd *)0x0,(VectorNd *)0x0,(VectorNd *)QDDot);
  uVar11 = 0;
  uVar6 = *(ulong *)(CS + 0x70);
  if (uVar6 != 0) {
    lVar5 = *(long *)(CS + 0x20);
    lVar4 = *(long *)(CS + 0x38);
    dVar14 = 0.0;
    dVar15 = 0.0;
    dVar16 = 0.0;
    uVar7 = 1;
    dVar17 = 0.0;
    dVar18 = 0.0;
    dVar19 = 0.0;
    uVar8 = 0;
    do {
      body_id = *(uint *)(lVar5 + uVar8 * 4);
      if (((uVar11 != body_id) || (pdVar1 = (double *)(lVar4 + uVar8 * 0x18), dVar15 != *pdVar1)) ||
         (NAN(dVar15) || NAN(*pdVar1))) {
LAB_001112b9:
        lVar2 = uVar8 * 0x18;
        CalcPointAcceleration
                  ((Vector3d *)&local_98,model,Q,QDot,(VectorNd *)QDDot,body_id,
                   (Vector3d *)(lVar4 + lVar2),false);
        lVar5 = *(long *)(CS + 0x20);
        lVar4 = *(long *)(CS + 0x38);
        uVar11 = *(uint *)(lVar5 + uVar8 * 4);
        dVar15 = *(double *)(lVar4 + lVar2);
        dVar16 = ((double *)(lVar4 + lVar2))[1];
        dVar19 = *(double *)(lVar4 + 0x10 + lVar2);
        uVar6 = *(ulong *)(CS + 0x70);
        dVar14 = local_98.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [2];
        dVar17 = local_98.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [0];
        dVar18 = local_98.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [1];
      }
      else {
        lVar2 = lVar4 + uVar8 * 0x18;
        pdVar1 = (double *)(lVar2 + 8);
        if ((dVar16 != *pdVar1) || (NAN(dVar16) || NAN(*pdVar1))) goto LAB_001112b9;
        pdVar1 = (double *)(lVar2 + 0x10);
        if ((dVar19 != *pdVar1) || (NAN(dVar19) || NAN(*pdVar1))) goto LAB_001112b9;
      }
      pdVar1 = (double *)(*(long *)(CS + 0x50) + uVar8 * 0x18);
      *(double *)(*(long *)(CS + 0xd0) + uVar8 * 8) =
           *(double *)(*(long *)(CS + 0x68) + uVar8 * 8) -
           (*(double *)(*(long *)(CS + 0x50) + 0x10 + uVar8 * 0x18) * dVar14 +
           pdVar1[1] * dVar18 + *pdVar1 * dVar17);
      uVar8 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar8 < uVar6);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcContactSystemVariables (
		Model &model,
		const Math::VectorNd &Q,
		const Math::VectorNd &QDot,
		const Math::VectorNd &Tau,
		ConstraintSet &CS
		) {
	// Compute C
	NonlinearEffects (model, Q, QDot, CS.C);
	assert (CS.H.cols() == model.dof_count && CS.H.rows() == model.dof_count);

	// Compute H
	CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

	// Compute G
	// We have to update model.X_base as they are not automatically computed
	// by NonlinearEffects()
	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		model.X_base[i] = model.X_lambda[i] * model.X_base[model.lambda[i]];
	}
	CalcContactJacobian (model, Q, CS, CS.G, false);

	// Compute gamma
	unsigned int prev_body_id = 0;
	Vector3d prev_body_point = Vector3d::Zero();
	Vector3d gamma_i = Vector3d::Zero();

	CS.QDDot_0.setZero();
	UpdateKinematicsCustom (model, NULL, NULL, &CS.QDDot_0);

	for (unsigned int i = 0; i < CS.size(); i++) {
		// only compute point accelerations when necessary
		if (prev_body_id != CS.body[i] || prev_body_point != CS.point[i]) {
			gamma_i = CalcPointAcceleration (model, Q, QDot, CS.QDDot_0, CS.body[i], CS.point[i], false);
			prev_body_id = CS.body[i];
			prev_body_point = CS.point[i];
		}

		// we also substract ContactData[i].acceleration such that the contact
		// point will have the desired acceleration
		CS.gamma[i] = CS.acceleration[i] - CS.normal[i].dot(gamma_i);
	}
}